

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O0

FT_Error cff_parse_blend(CFF_Parser parser)

{
  void *pvVar1;
  CFF_SubFont subFont_00;
  FT_Bool FVar2;
  FT_Long FVar3;
  FT_Error local_30;
  FT_Error error;
  FT_UInt numBlends;
  CFF_Blend blend;
  CFF_SubFont subFont;
  CFF_Private priv;
  CFF_Parser parser_local;
  
  pvVar1 = parser->object;
  if ((pvVar1 == (void *)0x0) || (*(long *)((long)pvVar1 + 0x2d0) == 0)) {
    local_30 = 3;
  }
  else {
    subFont_00 = *(CFF_SubFont *)((long)pvVar1 + 0x2d0);
    FVar2 = cff_blend_check_vector
                      (&subFont_00->blend,*(FT_UInt *)((long)pvVar1 + 0x2c8),subFont_00->lenNDV,
                       subFont_00->NDV);
    if ((FVar2 == '\0') ||
       (local_30 = cff_blend_build_vector
                             (&subFont_00->blend,*(FT_UInt *)((long)pvVar1 + 0x2c8),
                              subFont_00->lenNDV,subFont_00->NDV), local_30 == 0)) {
      FVar3 = cff_parse_num(parser,parser->top + -1);
      if (parser->stackSize < (uint)FVar3) {
        local_30 = 3;
      }
      else {
        local_30 = cff_blend_doBlend(subFont_00,parser,(uint)FVar3);
        (subFont_00->blend).usedBV = '\x01';
      }
    }
  }
  return local_30;
}

Assistant:

static FT_Error
  cff_parse_blend( CFF_Parser  parser )
  {
    /* blend operator can only be used in a Private DICT */
    CFF_Private  priv = (CFF_Private)parser->object;
    CFF_SubFont  subFont;
    CFF_Blend    blend;
    FT_UInt      numBlends;
    FT_Error     error;


    if ( !priv || !priv->subfont )
    {
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    subFont = priv->subfont;
    blend   = &subFont->blend;

    if ( cff_blend_check_vector( blend,
                                 priv->vsindex,
                                 subFont->lenNDV,
                                 subFont->NDV ) )
    {
      error = cff_blend_build_vector( blend,
                                      priv->vsindex,
                                      subFont->lenNDV,
                                      subFont->NDV );
      if ( error )
        goto Exit;
    }

    numBlends = (FT_UInt)cff_parse_num( parser, parser->top - 1 );
    if ( numBlends > parser->stackSize )
    {
      FT_ERROR(( "cff_parse_blend: Invalid number of blends\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    FT_TRACE4(( "   %d value%s blended\n",
                numBlends,
                numBlends == 1 ? "" : "s" ));

    error = cff_blend_doBlend( subFont, parser, numBlends );

    blend->usedBV = TRUE;

  Exit:
    return error;
  }